

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::Draw::anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams>::
createInstance(DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *this,
              Context *context)

{
  DrawTestInstanceBase *this_00;
  
  this_00 = (DrawTestInstanceBase *)operator_new(0x1a8);
  DrawTestInstanceBase::DrawTestInstanceBase(this_00,context);
  (this_00->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__DrawTestInstance_00bd8258;
  DrawIndirectParams::DrawIndirectParams((DrawIndirectParams *)(this_00 + 1),&this->m_data);
  (*(this_00->super_TestInstance)._vptr_TestInstance[3])(this_00);
  DrawTestInstanceBase::initialize(this_00,(DrawParamsBase *)(this_00 + 1));
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* DrawTestCase<T>::createInstance (Context& context) const
{
	return new DrawTestInstance<T>(context, m_data);
}